

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_process_sot(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_dec_tile_t *pjVar1;
  jpc_dec_cmpt_t *cmptparms;
  jas_image_t *pjVar2;
  jpc_streamlist_t *pjVar3;
  jpc_dec_cp_t *pjVar4;
  int local_4c;
  jpc_dec_cmpt_t *pjStack_48;
  int cmptno;
  jpc_dec_cmpt_t *cmpt;
  jas_image_cmptparm_t *compinfo;
  jas_image_cmptparm_t *compinfos;
  jpc_sot_t *sot;
  jpc_dec_tile_t *tile;
  jpc_ms_t *ms_local;
  jpc_dec_t *dec_local;
  
  if (dec->state == 4) {
    cmptparms = (jpc_dec_cmpt_t *)jas_alloc2((long)dec->numcomps,0x38);
    if (cmptparms == (jpc_dec_cmpt_t *)0x0) {
      return -1;
    }
    local_4c = 0;
    pjStack_48 = dec->cmpts;
    cmpt = cmptparms;
    for (; local_4c < dec->numcomps; local_4c = local_4c + 1) {
      cmpt->hstep = 0;
      cmpt->vstep = 0;
      *(int *)&cmpt->hsubstep = (int)pjStack_48->prec;
      *(uint *)((long)&cmpt->hsubstep + 4) = (uint)(pjStack_48->sgnd & 1);
      cmpt->prec = pjStack_48->width;
      *(uint_fast32_t *)&cmpt->sgnd = pjStack_48->height;
      cmpt->width = pjStack_48->hstep;
      cmpt->height = pjStack_48->vstep;
      pjStack_48 = pjStack_48 + 1;
      cmpt = (jpc_dec_cmpt_t *)&cmpt->vsubstep;
    }
    pjVar2 = jas_image_create(dec->numcomps,(jas_image_cmptparm_t *)cmptparms,0x4000);
    dec->image = pjVar2;
    if (pjVar2 == (jas_image_t *)0x0) {
      jas_free(cmptparms);
      return -1;
    }
    jas_free(cmptparms);
    if (dec->ppmstab != (jpc_ppxstab_t *)0x0) {
      pjVar3 = jpc_ppmstabtostreams(dec->ppmstab);
      dec->pkthdrstreams = pjVar3;
      if (pjVar3 == (jpc_streamlist_t *)0x0) {
        return -1;
      }
      jpc_ppxstab_destroy(dec->ppmstab);
      dec->ppmstab = (jpc_ppxstab_t *)0x0;
    }
  }
  if ((ms->parms).sot.len == 0) {
    dec->curtileendoff = 0;
  }
  else {
    dec->curtileendoff = (dec->in->rwcnt_ - ms->len) + -4 + (long)(ms->parms).poc.pchgs;
  }
  if ((int)(ms->parms).sot.tileno < dec->numtiles) {
    dec->curtile = dec->tiles + (ms->parms).sot.tileno;
    pjVar1 = dec->curtile;
    if ((uint)(ms->parms).sot.partno == pjVar1->partno) {
      if ((pjVar1->numparts < 1) || ((int)(uint)(ms->parms).sot.partno < pjVar1->numparts)) {
        if ((pjVar1->numparts == 0) && ((ms->parms).sot.numparts != '\0')) {
          pjVar1->numparts = (uint)(ms->parms).sot.numparts;
        }
        pjVar1->pptstab = (jpc_ppxstab_t *)0x0;
        if (pjVar1->state == 0) {
          pjVar1->state = 1;
          if (pjVar1->cp != (jpc_dec_cp_t *)0x0) {
            __assert_fail("!tile->cp",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                          ,0x22c,"int jpc_dec_process_sot(jpc_dec_t *, jpc_ms_t *)");
          }
          pjVar4 = jpc_dec_cp_copy(dec->cp);
          pjVar1->cp = pjVar4;
          if (pjVar4 == (jpc_dec_cp_t *)0x0) {
            return -1;
          }
          jpc_dec_cp_resetflags(dec->cp);
        }
        else if ((uint)(ms->parms).sot.numparts == (ms->parms).sot.partno - 1) {
          pjVar1->state = 2;
        }
        dec->state = 0x10;
        dec_local._4_4_ = 0;
      }
      else {
        dec_local._4_4_ = -1;
      }
    }
    else {
      dec_local._4_4_ = -1;
    }
  }
  else {
    jas_eprintf("invalid tile number in SOT marker segment\n");
    dec_local._4_4_ = -1;
  }
  return dec_local._4_4_;
}

Assistant:

static int jpc_dec_process_sot(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_dec_tile_t *tile;
	jpc_sot_t *sot = &ms->parms.sot;
	jas_image_cmptparm_t *compinfos;
	jas_image_cmptparm_t *compinfo;
	jpc_dec_cmpt_t *cmpt;
	int cmptno;

	if (dec->state == JPC_MH) {

		if (!(compinfos = jas_alloc2(dec->numcomps,
		  sizeof(jas_image_cmptparm_t)))) {
			return -1;
		}
		for (cmptno = 0, cmpt = dec->cmpts, compinfo = compinfos;
		  cmptno < dec->numcomps; ++cmptno, ++cmpt, ++compinfo) {
			compinfo->tlx = 0;
			compinfo->tly = 0;
			compinfo->prec = cmpt->prec;
			compinfo->sgnd = cmpt->sgnd;
			compinfo->width = cmpt->width;
			compinfo->height = cmpt->height;
			compinfo->hstep = cmpt->hstep;
			compinfo->vstep = cmpt->vstep;
		}

		if (!(dec->image = jas_image_create(dec->numcomps, compinfos,
		  JAS_CLRSPC_UNKNOWN))) {
			jas_free(compinfos);
			return -1;
		}
		jas_free(compinfos);

		/* Is the packet header information stored in PPM marker segments in
		  the main header? */
		if (dec->ppmstab) {
			/* Convert the PPM marker segment data into a collection of streams
			  (one stream per tile-part). */
			if (!(dec->pkthdrstreams = jpc_ppmstabtostreams(dec->ppmstab))) {
				return -1;
			}
			jpc_ppxstab_destroy(dec->ppmstab);
			dec->ppmstab = 0;
		}
	}

	if (sot->len > 0) {
		dec->curtileendoff = jas_stream_getrwcount(dec->in) - ms->len -
		  4 + sot->len;
	} else {
		dec->curtileendoff = 0;
	}

	if (JAS_CAST(int, sot->tileno) >= dec->numtiles) {
		jas_eprintf("invalid tile number in SOT marker segment\n");
		return -1;
	}
	/* Set the current tile. */
	dec->curtile = &dec->tiles[sot->tileno];
	tile = dec->curtile;
	/* Ensure that this is the expected part number. */
	if (sot->partno != tile->partno) {
		return -1;
	}
	if (tile->numparts > 0 && sot->partno >= tile->numparts) {
		return -1;
	}
	if (!tile->numparts && sot->numparts > 0) {
		tile->numparts = sot->numparts;
	}

	tile->pptstab = 0;

	switch (tile->state) {
	case JPC_TILE_INIT:
		/* This is the first tile-part for this tile. */
		tile->state = JPC_TILE_ACTIVE;
		assert(!tile->cp);
		if (!(tile->cp = jpc_dec_cp_copy(dec->cp))) {
			return -1;
		}
		jpc_dec_cp_resetflags(dec->cp);
		break;
	default:
		if (sot->numparts == sot->partno - 1) {
			tile->state = JPC_TILE_ACTIVELAST;
		}
		break;
	}

	/* Note: We do not increment the expected tile-part number until
	  all processing for this tile-part is complete. */

	/* We should expect to encounter other tile-part header marker
	  segments next. */
	dec->state = JPC_TPH;

	return 0;
}